

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O2

bool __thiscall
cmConditionEvaluator::HandleLevel0
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *errorString,
          MessageType *status)

{
  bool bVar1;
  bool bVar2;
  _Self __tmp;
  _List_node_base *p_Var3;
  int iVar4;
  string *value;
  const_iterator __last;
  allocator<char> local_d1;
  string *local_d0;
  MessageType *local_c8;
  cmExpandedCommandArgument *local_c0;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> newArgs2;
  string local_98;
  string local_78;
  cmExpandedCommandArgument local_58;
  
  p_Var3 = (_List_node_base *)newArgs;
  local_d0 = errorString;
  local_c8 = status;
  do {
    do {
      p_Var3 = p_Var3->_M_next;
      if (p_Var3 == (_List_node_base *)newArgs) {
LAB_002b71b2:
        return p_Var3 == (_List_node_base *)newArgs;
      }
      bVar1 = IsKeyword(this,&keyParenL_abi_cxx11_,(cmExpandedCommandArgument *)(p_Var3 + 1));
    } while (!bVar1);
    iVar4 = 1;
    __last._M_node = p_Var3;
    local_c0 = (cmExpandedCommandArgument *)(p_Var3 + 1);
    while( true ) {
      __last._M_node = (__last._M_node)->_M_next;
      if ((__last._M_node == (_List_node_base *)newArgs) || (iVar4 == 0)) break;
      bVar1 = IsKeyword(this,&keyParenL_abi_cxx11_,(cmExpandedCommandArgument *)(__last._M_node + 1)
                       );
      bVar2 = IsKeyword(this,&keyParenR_abi_cxx11_,(cmExpandedCommandArgument *)(__last._M_node + 1)
                       );
      iVar4 = (iVar4 + (uint)bVar1) - (uint)bVar2;
    }
    if (iVar4 != 0) {
      std::__cxx11::string::assign((char *)local_d0);
      *local_c8 = FATAL_ERROR;
      goto LAB_002b71b2;
    }
    newArgs2.
    super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    newArgs2.
    super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    newArgs2.
    super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>>::
    insert<std::_List_iterator<cmExpandedCommandArgument>,void>
              ((vector<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>> *)
               &newArgs2,(const_iterator)0x0,p_Var3->_M_next,
               (_List_iterator<cmExpandedCommandArgument>)__last._M_node);
    newArgs2.
    super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         newArgs2.
         super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
         _M_impl.super__Vector_impl_data._M_finish + -1;
    std::__cxx11::string::~string
              ((string *)
               newArgs2.
               super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    bVar1 = IsTrue(this,&newArgs2,local_d0,local_c8);
    value = &local_78;
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>((string *)value,"1",&local_d1);
      cmExpandedCommandArgument::cmExpandedCommandArgument(&local_58,value,true);
    }
    else {
      value = &local_98;
      std::__cxx11::string::string<std::allocator<char>>((string *)value,"0",&local_d1);
      cmExpandedCommandArgument::cmExpandedCommandArgument(&local_58,value,true);
    }
    cmExpandedCommandArgument::operator=(local_c0,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)value);
    std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::erase
              (newArgs,p_Var3->_M_next,__last);
    std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::~vector
              (&newArgs2);
  } while( true );
}

Assistant:

bool cmConditionEvaluator::HandleLevel0(cmArgumentList& newArgs,
                                        std::string& errorString,
                                        MessageType& status)
{
  int reducible;
  do {
    reducible = 0;
    cmArgumentList::iterator arg = newArgs.begin();
    while (arg != newArgs.end()) {
      if (IsKeyword(keyParenL, *arg)) {
        // search for the closing paren for this opening one
        cmArgumentList::iterator argClose;
        argClose = arg;
        argClose++;
        unsigned int depth = 1;
        while (argClose != newArgs.end() && depth) {
          if (this->IsKeyword(keyParenL, *argClose)) {
            depth++;
          }
          if (this->IsKeyword(keyParenR, *argClose)) {
            depth--;
          }
          argClose++;
        }
        if (depth) {
          errorString = "mismatched parenthesis in condition";
          status = MessageType::FATAL_ERROR;
          return false;
        }
        // store the reduced args in this vector
        std::vector<cmExpandedCommandArgument> newArgs2;

        // copy to the list structure
        cmArgumentList::iterator argP1 = arg;
        argP1++;
        newArgs2.insert(newArgs2.end(), argP1, argClose);
        newArgs2.pop_back();
        // now recursively invoke IsTrue to handle the values inside the
        // parenthetical expression
        bool value = this->IsTrue(newArgs2, errorString, status);
        if (value) {
          *arg = cmExpandedCommandArgument("1", true);
        } else {
          *arg = cmExpandedCommandArgument("0", true);
        }
        argP1 = arg;
        argP1++;
        // remove the now evaluated parenthetical expression
        newArgs.erase(argP1, argClose);
      }
      ++arg;
    }
  } while (reducible);
  return true;
}